

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O2

void __thiscall
glslang::TIntermediate::setShiftBindingForSet
          (TIntermediate *this,TResourceType res,uint shift,uint set)

{
  uint *puVar1;
  char *process;
  TProcesses *this_00;
  key_type_conflict1 local_24;
  
  if (shift != 0) {
    puVar1 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((this->shiftBindingForSet)._M_elems + res,&local_24);
    *puVar1 = shift;
    process = getResourceName(res);
    if (process != (char *)0x0) {
      this_00 = &this->processes;
      TProcesses::addProcess(this_00,process);
      TProcesses::addArgument(this_00,shift);
      TProcesses::addArgument(this_00,set);
    }
  }
  return;
}

Assistant:

void setShiftBindingForSet(TResourceType res, unsigned int shift, unsigned int set)
    {
        if (shift == 0) // ignore if there's no shift: it's a no-op.
            return;

        shiftBindingForSet[res][set] = shift;

        const char* name = getResourceName(res);
        if (name != nullptr) {
            processes.addProcess(name);
            processes.addArgument(shift);
            processes.addArgument(set);
        }
    }